

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA256_Internal_Transform(SHA_CTX *context,sha_word32 *data)

{
  sha_word32 sVar1;
  sha_word32 sVar2;
  sha_word32 sVar3;
  sha_word32 sVar4;
  uint uVar5;
  int iVar6;
  sha_word32 sVar7;
  sha_word32 sVar8;
  uint uVar9;
  uint uVar10;
  uint local_54;
  sha_word32 tmp;
  int j;
  sha_word32 *W256;
  sha_word32 T2;
  sha_word32 T1;
  sha_word32 s1;
  sha_word32 s0;
  sha_word32 h;
  sha_word32 g;
  sha_word32 f;
  sha_word32 e;
  sha_word32 d;
  sha_word32 c;
  sha_word32 b;
  sha_word32 a;
  sha_word32 *data_local;
  SHA_CTX *context_local;
  
  c = (context->s1).state[0];
  d = (context->s1).state[1];
  e = (context->s1).state[2];
  f = (context->s1).state[3];
  g = (context->s1).state[4];
  h = (context->s256).state[5];
  s0 = (context->s256).state[6];
  s1 = (context->s256).state[7];
  local_54 = 0;
  _b = data;
  do {
    uVar5 = *_b >> 0x10 | *_b << 0x10;
    *(uint *)((long)context + (long)(int)local_54 * 4 + 0x28) =
         (uVar5 & 0xff00ff00) >> 8 | (uVar5 & 0xff00ff) << 8;
    iVar6 = s1 + ((g >> 6 | g << 0x1a) ^ (g >> 0xb | g << 0x15) ^ (g >> 0x19 | g << 7)) +
            (g & h ^ (g ^ 0xffffffff) & s0) + K256[(int)local_54] +
            *(int *)((long)context + (long)(int)local_54 * 4 + 0x28);
    uVar5 = c & d;
    uVar9 = c & e;
    uVar10 = d & e;
    s1 = s0;
    s0 = h;
    h = g;
    g = f + iVar6;
    f = e;
    e = d;
    d = c;
    c = iVar6 + ((c >> 2 | c << 0x1e) ^ (c >> 0xd | c << 0x13) ^ (c >> 0x16 | c << 10)) +
                (uVar5 ^ uVar9 ^ uVar10);
    local_54 = local_54 + 1;
    sVar1 = s0;
    sVar2 = h;
    sVar7 = g;
    sVar3 = e;
    sVar4 = d;
    sVar8 = c;
    _b = _b + 1;
  } while ((int)local_54 < 0x10);
  do {
    c = sVar8;
    d = sVar4;
    e = sVar3;
    g = sVar7;
    h = sVar2;
    s0 = sVar1;
    uVar5 = *(uint *)((long)context + (long)(int)(local_54 + 1 & 0xf) * 4 + 0x28);
    uVar9 = *(uint *)((long)context + (long)(int)(local_54 + 0xe & 0xf) * 4 + 0x28);
    sVar1 = K256[(int)local_54];
    iVar6 = ((uVar9 >> 0x11 | uVar9 << 0xf) ^ (uVar9 >> 0x13 | uVar9 << 0xd) ^ uVar9 >> 10) +
            *(int *)((long)context + (long)(int)(local_54 + 9 & 0xf) * 4 + 0x28) +
            ((uVar5 >> 7 | uVar5 << 0x19) ^ (uVar5 >> 0x12 | uVar5 << 0xe) ^ uVar5 >> 3) +
            *(int *)((long)context + (long)(int)(local_54 & 0xf) * 4 + 0x28);
    *(int *)((long)context + (long)(int)(local_54 & 0xf) * 4 + 0x28) = iVar6;
    iVar6 = s1 + ((g >> 6 | g << 0x1a) ^ (g >> 0xb | g << 0x15) ^ (g >> 0x19 | g << 7)) +
            (g & h ^ (g ^ 0xffffffff) & s0) + sVar1 + iVar6;
    s1 = s0;
    sVar7 = f + iVar6;
    f = e;
    sVar8 = iVar6 + ((c >> 2 | c << 0x1e) ^ (c >> 0xd | c << 0x13) ^ (c >> 0x16 | c << 10)) +
                    (c & d ^ c & e ^ d & e);
    local_54 = local_54 + 1;
    sVar1 = h;
    sVar2 = g;
    sVar3 = d;
    sVar4 = c;
  } while ((int)local_54 < 0x40);
  (context->s1).state[0] = sVar8 + (context->s1).state[0];
  (context->s1).state[1] = c + (context->s1).state[1];
  (context->s1).state[2] = d + (context->s1).state[2];
  (context->s1).state[3] = e + (context->s1).state[3];
  (context->s1).state[4] = sVar7 + (context->s1).state[4];
  (context->s256).state[5] = g + (context->s256).state[5];
  (context->s256).state[6] = h + (context->s256).state[6];
  (context->s256).state[7] = s0 + (context->s256).state[7];
  return;
}

Assistant:

void SHA256_Internal_Transform(SHA_CTX* context, const sha_word32* data) {
	sha_word32	a, b, c, d, e, f, g, h, s0, s1;
	sha_word32	T1, T2, *W256;
	int		j;

	W256 = (sha_word32*)context->s256.buffer;

	/* Initialize registers with the prev. intermediate value */
	a = context->s256.state[0];
	b = context->s256.state[1];
	c = context->s256.state[2];
	d = context->s256.state[3];
	e = context->s256.state[4];
	f = context->s256.state[5];
	g = context->s256.state[6];
	h = context->s256.state[7];

	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Copy data while converting to host byte order */
		REVERSE32(*data++,W256[j]);
		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + W256[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		/* Apply the SHA-256 compression function to update a..h with copy */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + (W256[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W256[(j+1)&0x0f];
		s0 = sigma0_256(s0);
		s1 = W256[(j+14)&0x0f];
		s1 = sigma1_256(s1);

		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] +
		     (W256[j&0x0f] += s1 + W256[(j+9)&0x0f] + s0);
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 64);

	/* Compute the current intermediate hash value */
	context->s256.state[0] += a;
	context->s256.state[1] += b;
	context->s256.state[2] += c;
	context->s256.state[3] += d;
	context->s256.state[4] += e;
	context->s256.state[5] += f;
	context->s256.state[6] += g;
	context->s256.state[7] += h;

	/* Clean up */
	a = b = c = d = e = f = g = h = T1 = T2 = 0;
}